

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

bool __thiscall sylvan::Bdd::operator<=(Bdd *this,Bdd *other)

{
  char cVar1;
  BDDVAR in_ECX;
  BDD in_RDX;
  
  cVar1 = sylvan_disjoint_RUN((sylvan *)this->bdd,other->bdd ^ 0x8000000000000000,in_RDX,in_ECX);
  return cVar1 == '\x01';
}

Assistant:

bool
Bdd::operator<=(const Bdd& other) const
{
    return sylvan_subset(this->bdd, other.bdd) == 1;
}